

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

void __thiscall
mini_bus::
NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::failed(NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,exception_ptr *ptr)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  exception_ptr *ptr_local;
  NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  lock._M_device = (mutex_type *)ptr;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx);
  std::__exception_ptr::exception_ptr::operator=(&this->ex,ptr);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  std::condition_variable::notify_one();
  return;
}

Assistant:

inline void failed(std::exception_ptr ptr) override {
    {
      std::lock_guard lock{mtx};
      ex = ptr;
    }
    cv.notify_one();
  }